

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  uint uVar618;
  int iVar619;
  ulong uVar620;
  ulong uVar621;
  ulong uVar622;
  ulong uVar623;
  ulong uVar624;
  ulong uVar625;
  ulong uVar626;
  ulong uVar627;
  ulong uVar628;
  ulong uVar629;
  ulong uVar630;
  ulong uVar631;
  ulong uVar632;
  ulong uVar633;
  long lVar634;
  ulong uVar635;
  ulong uVar636;
  long lVar637;
  ulong uVar638;
  ulong uVar639;
  ulong uVar640;
  ulong uVar641;
  ulong uVar642;
  ulong uVar643;
  ulong uVar644;
  long lVar645;
  long lVar646;
  uint uVar647;
  ulong uVar648;
  ulong uVar649;
  ulong uVar650;
  ulong uVar651;
  ulong uVar652;
  ulong uVar653;
  ulong uVar654;
  ulong uVar655;
  ulong uVar656;
  ulong uVar657;
  ulong uVar658;
  ulong uVar659;
  ulong uVar660;
  long lVar661;
  int vflag;
  secp256k1_fe local_58;
  
  uVar651 = (a->z).n[0];
  uVar628 = (a->z).n[1];
  uVar633 = (a->z).n[3];
  uVar626 = uVar651 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar633;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar626;
  uVar636 = (a->z).n[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar636;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar628 * 2;
  uVar639 = (a->z).n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar639;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar639;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar8 * auVar330,0);
  auVar6 = auVar9 * ZEXT816(0x1000003d10) + auVar7 * auVar329 + auVar6 * auVar328;
  uVar630 = uVar639 * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar630;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar651;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar633;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar628 * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar636;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar636;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar8 * auVar330,8);
  auVar9 = auVar13 * ZEXT816(0x1000003d10000) +
           auVar10 * auVar331 + auVar12 * auVar333 + auVar11 * auVar332 + (auVar6 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar651;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar651;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar630;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar628;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar633;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar636 * 2;
  auVar7 = auVar16 * auVar336 + auVar15 * auVar335 + (auVar9 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
  auVar8 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar334;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar628;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar626;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar630;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar636;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar633;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar633;
  auVar7 = auVar20 * auVar339 + auVar19 * auVar338 + (auVar7 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar10 = (auVar8 >> 0x34) + auVar18 * auVar337 + auVar21 * ZEXT816(0x1000003d10);
  uVar640 = auVar10._0_8_;
  uVar652 = auVar10._8_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar636;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar626;
  auVar587._8_8_ = uVar652 >> 0x34;
  auVar587._0_8_ = uVar652 * 0x1000 | uVar640 >> 0x34;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar628;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar628;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar630;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar633;
  auVar7 = auVar24 * auVar342 + (auVar7 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar7._0_8_;
  auVar587 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar341 + auVar22 * auVar340 + auVar587;
  auVar10 = auVar587 >> 0x34;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = auVar10._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar7._8_8_;
  auVar588._8_8_ = auVar10._8_8_;
  auVar588._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar589 = auVar26 * ZEXT816(0x1000003d10000) + auVar588 + auVar589;
  uVar620 = auVar589._0_8_;
  uVar621 = uVar620 & 0xfffffffffffff;
  uVar626 = (b->x).n[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar621;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar626;
  uVar622 = auVar587._0_8_ & 0xfffffffffffff;
  uVar630 = (b->x).n[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar622;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar630;
  uVar640 = uVar640 & 0xfffffffffffff;
  uVar652 = (b->x).n[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar640;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar652;
  uVar623 = auVar8._0_8_ & 0xfffffffffffff;
  uVar655 = (b->x).n[3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar623;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar655;
  uVar624 = (auVar589._8_8_ << 0xc | uVar620 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
  uVar620 = (b->x).n[4];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar624;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar620;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SUB168(auVar31 * auVar347,0);
  auVar6 = auVar32 * ZEXT816(0x1000003d10) +
           auVar27 * auVar343 + auVar29 * auVar345 + auVar30 * auVar346 + auVar28 * auVar344;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar624;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar626;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar621;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar630;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar622;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar652;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar640;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar655;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar623;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar620;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SUB168(auVar31 * auVar347,8);
  auVar7 = auVar38 * ZEXT816(0x1000003d10000) +
           auVar33 * auVar348 +
           auVar34 * auVar349 + auVar35 * auVar350 + auVar37 * auVar352 + auVar36 * auVar351 +
           (auVar6 >> 0x34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar623;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar626;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar624;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar630;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar621;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar652;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar622;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar655;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar640;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar620;
  auVar8 = auVar43 * auVar357 + auVar42 * auVar356 + auVar41 * auVar355 + auVar40 * auVar354 +
           (auVar7 >> 0x34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
  auVar9 = auVar39 * auVar353 + auVar44 * ZEXT816(0x1000003d1);
  uVar625 = auVar9._0_8_;
  uVar629 = auVar9._8_8_;
  auVar578._8_8_ = uVar629 >> 0x34;
  auVar578._0_8_ = uVar629 * 0x1000 | uVar625 >> 0x34;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar640;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar626;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar623;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar630;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar624;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar652;
  uVar625 = uVar625 & 0xfffffffffffff;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar621;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar655;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar622;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar620;
  auVar8 = auVar47 * auVar360 + auVar49 * auVar362 + auVar48 * auVar361 + (auVar8 >> 0x34);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar578 = auVar50 * ZEXT816(0x1000003d10) + auVar45 * auVar358 + auVar46 * auVar359 + auVar578;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar622;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar626;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar640;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar630;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar623;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar652;
  uVar657 = auVar578._0_8_ & 0xfffffffffffff;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar624;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar655;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar621;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar620;
  auVar8 = auVar55 * auVar367 + auVar54 * auVar366 + (auVar8 >> 0x34);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar8._0_8_;
  auVar9 = auVar56 * ZEXT816(0x1000003d10) +
           auVar51 * auVar363 + auVar53 * auVar365 + auVar52 * auVar364 + (auVar578 >> 0x34);
  auVar10 = auVar9 >> 0x34;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = auVar10._0_8_;
  uVar653 = auVar9._0_8_ & 0xfffffffffffff;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar8._8_8_;
  auVar590._8_8_ = auVar10._8_8_;
  auVar590._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar591 = auVar57 * ZEXT816(0x1000003d10000) + auVar590 + auVar591;
  uVar654 = auVar591._0_8_;
  uVar626 = (b->y).n[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar621;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar626;
  uVar630 = (b->y).n[1];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar622;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = uVar630;
  uVar652 = (b->y).n[2];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar640;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar652;
  uVar655 = (b->y).n[3];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar623;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = uVar655;
  lVar661 = (auVar591._8_8_ << 0xc | uVar654 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  uVar620 = (b->y).n[4];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar624;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uVar620;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = SUB168(auVar62 * auVar372,0);
  uVar654 = uVar654 & 0xfffffffffffff;
  auVar6 = auVar63 * ZEXT816(0x1000003d10) +
           auVar58 * auVar368 + auVar60 * auVar370 + auVar61 * auVar371 + auVar59 * auVar369;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar624;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar626;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar621;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uVar630;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar622;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = uVar652;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar640;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar655;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar623;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar620;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = SUB168(auVar62 * auVar372,8);
  auVar7 = auVar69 * ZEXT816(0x1000003d10000) +
           auVar68 * auVar377 + auVar67 * auVar376 + auVar66 * auVar375 + auVar65 * auVar374 +
           auVar64 * auVar373 + (auVar6 >> 0x34);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar623;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar626;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar624;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar630;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar621;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar652;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar622;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar655;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar640;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar620;
  auVar8 = auVar74 * auVar382 + auVar73 * auVar381 + auVar72 * auVar380 + auVar71 * auVar379 +
           (auVar7 >> 0x34);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
  auVar9 = auVar70 * auVar378 + auVar75 * ZEXT816(0x1000003d1);
  uVar629 = auVar9._0_8_;
  uVar648 = auVar9._8_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar640;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar626;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar623;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar630;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar624;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar652;
  auVar592._8_8_ = uVar648 >> 0x34;
  auVar592._0_8_ = uVar648 * 0x1000 | uVar629 >> 0x34;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar621;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar655;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar622;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar620;
  auVar8 = auVar78 * auVar385 + auVar80 * auVar387 + auVar79 * auVar386 + (auVar8 >> 0x34);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar592 = auVar81 * ZEXT816(0x1000003d10) + auVar77 * auVar384 + auVar76 * auVar383 + auVar592;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar622;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar626;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar640;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar630;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar623;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar652;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar624;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar655;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar621;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar620;
  auVar8 = auVar86 * auVar392 + auVar85 * auVar391 + (auVar8 >> 0x34);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = auVar8._0_8_;
  auVar9 = auVar87 * ZEXT816(0x1000003d10) +
           auVar84 * auVar390 + auVar83 * auVar389 + auVar82 * auVar388 + (auVar592 >> 0x34);
  auVar10 = auVar9 >> 0x34;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = auVar10._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = auVar8._8_8_;
  auVar593._8_8_ = auVar10._8_8_;
  auVar593._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar594 = auVar88 * ZEXT816(0x1000003d10000) + auVar593 + auVar594;
  uVar655 = auVar594._0_8_;
  uVar629 = uVar629 & 0xfffffffffffff;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar629;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar633;
  uVar652 = (auVar594._8_8_ << 0xc | uVar655 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  uVar621 = auVar592._0_8_ & 0xfffffffffffff;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar621;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar636;
  uVar620 = auVar9._0_8_ & 0xfffffffffffff;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar620;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar628;
  uVar655 = uVar655 & 0xfffffffffffff;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar655;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar651;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar652;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar639;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = SUB168(auVar93 * auVar397,0);
  auVar9 = auVar90 * auVar394 + auVar89 * auVar393 + auVar91 * auVar395 + auVar92 * auVar396 +
           auVar94 * ZEXT816(0x1000003d10);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar629;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar639;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar621;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar633;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar620;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar636;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar655;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar628;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar652;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar651;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = SUB168(auVar93 * auVar397,8);
  auVar6 = auVar100 * ZEXT816(0x1000003d10000) +
           auVar99 * auVar402 +
           auVar98 * auVar401 + auVar97 * auVar400 + auVar95 * auVar398 + auVar96 * auVar399 +
           (auVar9 >> 0x34);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar629;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar651;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar621;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar639;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar620;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar633;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar655;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar636;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar652;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar628;
  auVar7 = auVar105 * auVar407 + auVar104 * auVar406 + auVar103 * auVar405 + auVar102 * auVar404 +
           (auVar6 >> 0x34);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar101 * auVar403 + auVar106 * ZEXT816(0x1000003d1);
  uVar626 = auVar8._0_8_;
  uVar630 = auVar8._8_8_;
  auVar579._8_8_ = uVar630 >> 0x34;
  auVar579._0_8_ = uVar630 * 0x1000 | uVar626 >> 0x34;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar629;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar628;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar621;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar651;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar620;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar639;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar655;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar633;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar652;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar636;
  auVar7 = auVar111 * auVar412 + auVar110 * auVar411 + auVar109 * auVar410 + (auVar7 >> 0x34);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar579 = auVar112 * ZEXT816(0x1000003d10) + auVar107 * auVar408 + auVar108 * auVar409 + auVar579
  ;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar629;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar636;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar621;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar628;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar620;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = uVar651;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar655;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar639;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar652;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar633;
  auVar7 = auVar117 * auVar417 + auVar116 * auVar416 + (auVar7 >> 0x34);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar7._0_8_;
  auVar8 = auVar118 * ZEXT816(0x1000003d10) +
           auVar115 * auVar415 + auVar114 * auVar414 + auVar113 * auVar413 + (auVar579 >> 0x34);
  auVar10 = auVar8 >> 0x34;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = auVar10._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar7._8_8_;
  auVar595._8_8_ = auVar10._8_8_;
  auVar595._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar596 = auVar119 * ZEXT816(0x1000003d10000) + auVar595 + auVar596;
  uVar652 = auVar596._0_8_;
  uVar1 = (a->y).n[4];
  uVar656 = (auVar6._0_8_ & 0xffffffffffff) + uVar1 + (auVar596._8_8_ << 0xc | uVar652 >> 0x34);
  uVar2 = (a->y).n[0];
  uVar621 = (uVar626 & 0xfffffffffffff) + uVar2;
  uVar3 = (a->y).n[1];
  uVar622 = (auVar579._0_8_ & 0xfffffffffffff) + uVar3;
  uVar4 = (a->y).n[2];
  uVar641 = (auVar8._0_8_ & 0xfffffffffffff) + uVar4;
  uVar620 = (a->x).n[0];
  uVar623 = (a->x).n[3];
  uVar635 = uVar620 + uVar625;
  uVar630 = uVar654 + uVar623;
  uVar626 = uVar635 * 2;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar630;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar626;
  uVar5 = (a->y).n[3];
  uVar649 = (uVar652 & 0xfffffffffffff) + uVar5;
  uVar624 = (a->x).n[1];
  uVar629 = (a->x).n[2];
  uVar652 = uVar657 + uVar624;
  uVar655 = uVar653 + uVar629;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar655;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar652 * 2;
  uVar640 = (a->x).n[4];
  uVar631 = uVar640 + lVar661;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar631;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar631;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = SUB168(auVar122 * auVar420,0);
  auVar8 = auVar121 * auVar419 + auVar120 * auVar418 + auVar123 * ZEXT816(0x1000003d10);
  uVar648 = uVar631 * 2;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar648;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = uVar635;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar630;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uVar652 * 2;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar655;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = uVar655;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = SUB168(auVar122 * auVar420,8);
  auVar6 = auVar127 * ZEXT816(0x1000003d10000) +
           auVar124 * auVar421 + auVar126 * auVar423 + auVar125 * auVar422 + (auVar8 >> 0x34);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar635;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uVar635;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar648;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = uVar652;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar630;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar655 * 2;
  auVar7 = auVar130 * auVar426 + auVar129 * auVar425 + (auVar6 >> 0x34);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar9 = auVar128 * auVar424 + auVar131 * ZEXT816(0x1000003d1);
  uVar627 = auVar9._0_8_;
  uVar643 = auVar9._8_8_;
  auVar616._8_8_ = uVar643 >> 0x34;
  auVar616._0_8_ = uVar643 * 0x1000 | uVar627 >> 0x34;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar652;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = uVar626;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar648;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uVar655;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar630;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar630;
  auVar7 = auVar134 * auVar429 + auVar133 * auVar428 + (auVar7 >> 0x34);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar616 = auVar132 * auVar427 + auVar135 * ZEXT816(0x1000003d10) + auVar616;
  uVar643 = auVar616._0_8_;
  uVar632 = auVar616._8_8_;
  auVar580._8_8_ = uVar632 >> 0x34;
  auVar580._0_8_ = uVar632 * 0x1000 | uVar643 >> 0x34;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar655;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uVar626;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar652;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = uVar652;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar648;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar630;
  auVar7 = auVar138 * auVar432 + (auVar7 >> 0x34);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = auVar7._0_8_;
  auVar580 = auVar139 * ZEXT816(0x1000003d10) + auVar137 * auVar431 + auVar136 * auVar430 + auVar580
  ;
  auVar9 = auVar580 >> 0x34;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = auVar9._0_8_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar7._8_8_;
  auVar597._8_8_ = auVar9._8_8_;
  auVar597._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
  auVar598 = auVar140 * ZEXT816(0x1000003d10000) + auVar597 + auVar598;
  uVar644 = auVar598._0_8_;
  uVar625 = 0x3ffffbfffff0bc - uVar625;
  uVar657 = 0x3ffffffffffffc - uVar657;
  uVar654 = 0x3ffffffffffffc - uVar654;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar654;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = uVar620;
  uVar653 = 0x3ffffffffffffc - uVar653;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar653;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uVar624;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar657;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar629;
  uVar658 = 0x3fffffffffffc - lVar661;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar625;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uVar623;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar658;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = uVar640;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = SUB168(auVar145 * auVar437,0);
  auVar7 = auVar146 * ZEXT816(0x1000003d10) +
           auVar141 * auVar433 + auVar142 * auVar434 + auVar144 * auVar436 + auVar143 * auVar435;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar658;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar620;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar654;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar624;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar653;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar629;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar657;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar623;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar625;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar640;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = SUB168(auVar145 * auVar437,8);
  auVar8 = auVar152 * ZEXT816(0x1000003d10000) +
           auVar147 * auVar438 +
           auVar148 * auVar439 + auVar149 * auVar440 + auVar151 * auVar442 + auVar150 * auVar441 +
           (auVar7 >> 0x34);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar625;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar620;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar658;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar624;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar654;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar629;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar653;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar623;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar657;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar640;
  auVar9 = (auVar8 >> 0x34) +
           auVar157 * auVar447 + auVar156 * auVar446 + auVar155 * auVar445 + auVar154 * auVar444;
  uVar626 = auVar9._0_8_;
  uVar648 = auVar9._8_8_;
  auVar617._8_8_ = uVar648 >> 0x34;
  auVar617._0_8_ = uVar648 * 0x1000 | uVar626 >> 0x34;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar626 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar8._6_2_ & 0xf);
  auVar9 = auVar153 * auVar443 + auVar158 * ZEXT816(0x1000003d1);
  uVar648 = auVar9._0_8_;
  uVar626 = auVar9._8_8_;
  auVar581._8_8_ = uVar626 >> 0x34;
  auVar581._0_8_ = uVar626 * 0x1000 | uVar648 >> 0x34;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar657;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = uVar620;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar625;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar624;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar658;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar629;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar654;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar623;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar653;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar640;
  auVar617 = auVar161 * auVar450 + auVar163 * auVar452 + auVar162 * auVar451 + auVar617;
  uVar626 = auVar617._0_8_;
  uVar632 = auVar617._8_8_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar626 & 0xfffffffffffff;
  auVar581 = auVar164 * ZEXT816(0x1000003d10) + auVar159 * auVar448 + auVar160 * auVar449 + auVar581
  ;
  auVar582._8_8_ = uVar632 >> 0x34;
  auVar582._0_8_ = uVar632 * 0x1000 | uVar626 >> 0x34;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar653;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar620;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar657;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar624;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar625;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar629;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar658;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar623;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar654;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uVar640;
  auVar582 = auVar169 * auVar457 + auVar168 * auVar456 + auVar582;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = auVar582._0_8_;
  auVar9 = auVar170 * ZEXT816(0x1000003d10) +
           auVar165 * auVar453 + auVar167 * auVar455 + auVar166 * auVar454 + (auVar581 >> 0x34);
  auVar10 = auVar9 >> 0x34;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = auVar10._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = auVar582._8_8_;
  auVar599._8_8_ = auVar10._8_8_;
  auVar599._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar600 = auVar171 * ZEXT816(0x1000003d10000) + auVar599 + auVar600;
  uVar650 = auVar600._0_8_;
  local_58.n[0] = uVar621;
  local_58.n[1] = uVar622;
  local_58.n[2] = uVar641;
  local_58.n[3] = uVar649;
  local_58.n[4] = uVar656;
  uVar618 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
  uVar647 = uVar618 ^ 1;
  uVar626 = (long)(int)uVar647 - 1;
  uVar632 = -(long)(int)uVar647;
  uVar638 = (uVar648 & 0xfffffffffffff) + (uVar627 & 0xfffffffffffff) & uVar632 |
            uVar2 * 2 & uVar626;
  uVar660 = (auVar581._0_8_ & 0xfffffffffffff) + (uVar643 & 0xfffffffffffff) & uVar632 |
            uVar3 * 2 & uVar626;
  uVar642 = (auVar9._0_8_ & 0xfffffffffffff) + (auVar580._0_8_ & 0xfffffffffffff) & uVar632 |
            uVar4 * 2 & uVar626;
  uVar648 = (uVar650 & 0xfffffffffffff) + (uVar644 & 0xfffffffffffff) & uVar632 |
            uVar5 * 2 & uVar626;
  uVar632 = uVar632 & (auVar8._0_8_ & 0xffffffffffff) + (auVar6._0_8_ & 0xffffffffffff) +
                      (auVar598._8_8_ << 0xc | uVar644 >> 0x34) +
                      (auVar600._8_8_ << 0xc | uVar650 >> 0x34) | uVar1 * 2 & uVar626;
  uVar626 = (long)(int)uVar647 - 1;
  uVar627 = -(long)(int)uVar647;
  uVar644 = uVar621 & uVar627 | uVar625 + uVar620 & uVar626;
  uVar650 = uVar622 & uVar627 | uVar657 + uVar624 & uVar626;
  uVar659 = uVar641 & uVar627 | uVar653 + uVar629 & uVar626;
  uVar657 = uVar649 & uVar627 | uVar654 + uVar623 & uVar626;
  uVar627 = uVar627 & uVar656 | uVar658 + uVar640 & uVar626;
  uVar626 = uVar644 * 2;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar657;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar626;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar659;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar650 * 2;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar627;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar627;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = SUB168(auVar174 * auVar460,0);
  auVar9 = auVar173 * auVar459 + auVar172 * auVar458 + auVar175 * ZEXT816(0x1000003d10);
  uVar620 = uVar627 * 2;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar620;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar644;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar657;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar650 * 2;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar659;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar659;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = SUB168(auVar174 * auVar460,8);
  auVar6 = auVar179 * ZEXT816(0x1000003d10000) +
           auVar176 * auVar461 + auVar178 * auVar463 + auVar177 * auVar462 + (auVar9 >> 0x34);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar644;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar644;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar620;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar650;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar657;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar659 * 2;
  auVar7 = auVar182 * auVar466 + auVar181 * auVar465 + (auVar6 >> 0x34);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar183 * ZEXT816(0x1000003d1) + auVar180 * auVar464;
  uVar623 = auVar8._0_8_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar650;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar626;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar620;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar659;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar657;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar657;
  auVar7 = auVar186 * auVar469 + auVar185 * auVar468 + (auVar7 >> 0x34);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar8 = auVar187 * ZEXT816(0x1000003d10) + auVar184 * auVar467 + (auVar8 >> 0x34);
  uVar624 = auVar8._0_8_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar659;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar626;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar650;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar650;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar620;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar657;
  auVar7 = auVar190 * auVar472 + (auVar7 >> 0x34);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = auVar7._0_8_;
  auVar8 = auVar191 * ZEXT816(0x1000003d10) + auVar189 * auVar471 + auVar188 * auVar470 +
           (auVar8 >> 0x34);
  uVar654 = auVar8._0_8_;
  auVar8 = auVar8 >> 0x34;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = auVar8._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = auVar7._8_8_;
  auVar601._8_8_ = auVar8._8_8_;
  auVar601._0_8_ = auVar9._0_8_ & 0xffffffffffffe;
  auVar602 = auVar192 * ZEXT816(0x1000003d10000) + auVar601 + auVar602;
  uVar629 = auVar602._0_8_;
  uVar626 = (auVar602._8_8_ << 0xc | uVar629 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  uVar635 = 0xbffff3ffffd234 - uVar635;
  uVar652 = 0xbffffffffffff4 - uVar652;
  uVar655 = 0xbffffffffffff4 - uVar655;
  uVar630 = 0xbffffffffffff4 - uVar630;
  uVar629 = uVar629 & 0xfffffffffffff;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar629;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar635;
  uVar631 = 0xbfffffffffff4 - uVar631;
  uVar653 = uVar654 & 0xfffffffffffff;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar653;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar652;
  uVar625 = uVar624 & 0xfffffffffffff;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar625;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar655;
  uVar640 = uVar623 & 0xfffffffffffff;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar640;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar630;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar626;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar631;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = SUB168(auVar197 * auVar477,0);
  auVar6 = auVar198 * ZEXT816(0x1000003d10) +
           auVar193 * auVar473 + auVar194 * auVar474 + auVar195 * auVar475 + auVar196 * auVar476;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar626;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = uVar635;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar629;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar652;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar653;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar655;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar625;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar630;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar640;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar631;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = SUB168(auVar197 * auVar477,8);
  auVar7 = auVar204 * ZEXT816(0x1000003d10000) +
           auVar199 * auVar478 +
           auVar200 * auVar479 + auVar201 * auVar480 + auVar203 * auVar482 + auVar202 * auVar481 +
           (auVar6 >> 0x34);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar640;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar635;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar626;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar652;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar629;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar655;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar653;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar630;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar625;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar631;
  auVar8 = auVar207 * auVar485 + auVar209 * auVar487 + auVar208 * auVar486 + auVar206 * auVar484 +
           (auVar7 >> 0x34);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
  auVar9 = auVar205 * auVar483 + auVar210 * ZEXT816(0x1000003d1);
  uVar620 = auVar9._0_8_;
  uVar643 = auVar9._8_8_;
  auVar583._8_8_ = uVar643 >> 0x34;
  auVar583._0_8_ = uVar643 * 0x1000 | uVar620 >> 0x34;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar625;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar635;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar640;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar652;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar626;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar655;
  uVar620 = uVar620 & 0xfffffffffffff;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar629;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar630;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar653;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar631;
  auVar8 = auVar213 * auVar490 + auVar215 * auVar492 + auVar214 * auVar491 + (auVar8 >> 0x34);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar583 = auVar216 * ZEXT816(0x1000003d10) + auVar211 * auVar488 + auVar212 * auVar489 + auVar583
  ;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar653;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar635;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar625;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar652;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar640;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar655;
  uVar652 = auVar583._0_8_ & 0xfffffffffffff;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar626;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar630;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar629;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar631;
  auVar8 = auVar221 * auVar497 + auVar220 * auVar496 + (auVar8 >> 0x34);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = auVar8._0_8_;
  auVar9 = auVar222 * ZEXT816(0x1000003d10) +
           auVar218 * auVar494 + auVar219 * auVar495 + auVar217 * auVar493 + (auVar583 >> 0x34);
  auVar10 = auVar9 >> 0x34;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = auVar10._0_8_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = auVar8._8_8_;
  uVar630 = auVar9._0_8_ & 0xfffffffffffff;
  auVar603._8_8_ = auVar10._8_8_;
  auVar603._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar604 = auVar223 * ZEXT816(0x1000003d10000) + auVar603 + auVar604;
  uVar655 = auVar604._0_8_;
  lVar661 = (auVar604._8_8_ << 0xc | uVar655 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  uVar655 = uVar655 & 0xfffffffffffff;
  uVar623 = uVar623 * 2 & 0x1ffffffffffffe;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar629;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar623;
  uVar643 = uVar624 * 2 & 0x1ffffffffffffe;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar653;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar643;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar626;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar626;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = SUB168(auVar226 * auVar500,0);
  auVar6 = auVar225 * auVar499 + auVar224 * auVar498 + auVar227 * ZEXT816(0x1000003d10);
  uVar624 = auVar6._0_8_;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = auVar6._8_8_ << 0xc | uVar624 >> 0x34;
  uVar626 = uVar626 * 2;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar640;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar626;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar629;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar643;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar653;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar653;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = SUB168(auVar226 * auVar500,8);
  auVar605 = auVar231 * ZEXT816(0x1000003d10000) +
             auVar228 * auVar501 + auVar230 * auVar503 + auVar229 * auVar502 + auVar605;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar640;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar640;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar625;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar626;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar629;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar654 * 2 & 0x1ffffffffffffe;
  auVar6 = auVar234 * auVar506 + auVar233 * auVar505 + (auVar605 >> 0x34);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar605._6_2_ & 0xf);
  auVar7 = auVar235 * ZEXT816(0x1000003d1) + auVar232 * auVar504;
  uVar640 = auVar7._0_8_;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = auVar7._8_8_ << 0xc | uVar640 >> 0x34;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar625;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar623;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar653;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar626;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar629;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar629;
  auVar6 = auVar238 * auVar509 + auVar237 * auVar508 + (auVar6 >> 0x34);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar606 = auVar239 * ZEXT816(0x1000003d10) + auVar236 * auVar507 + auVar606;
  uVar658 = auVar606._0_8_;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = auVar606._8_8_ << 0xc | uVar658 >> 0x34;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar653;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar623;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar625;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar625;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar629;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar626;
  auVar6 = auVar242 * auVar512 + (auVar6 >> 0x34);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = auVar6._0_8_;
  auVar607 = auVar243 * ZEXT816(0x1000003d10) + auVar241 * auVar511 + auVar240 * auVar510 + auVar607
  ;
  uVar643 = auVar607._0_8_;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = auVar607._8_8_ << 0xc | uVar643 >> 0x34;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = auVar6._8_8_;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = uVar624 & 0xffffffffffffe;
  auVar609 = auVar244 * ZEXT816(0x1000003d10000) + auVar608 + auVar609;
  uVar654 = auVar609._0_8_;
  uVar626 = (long)(int)uVar618 - 1;
  uVar635 = -(long)(int)uVar618;
  uVar629 = uVar626 & 0xfffffffffffff;
  uVar623 = uVar638 * 2;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar648;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar623;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar642;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar660 * 2;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar632;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar632;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = SUB168(auVar247 * auVar515,0);
  auVar8 = auVar246 * auVar514 + auVar245 * auVar513 + auVar248 * ZEXT816(0x1000003d10);
  uVar624 = uVar632 * 2;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar624;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar638;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar648;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar660 * 2;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar642;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar642;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = SUB168(auVar247 * auVar515,8);
  auVar6 = auVar252 * ZEXT816(0x1000003d10000) +
           auVar249 * auVar516 + auVar251 * auVar518 + auVar250 * auVar517 + (auVar8 >> 0x34);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar638;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar638;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar624;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar660;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar648;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar642 * 2;
  auVar7 = auVar255 * auVar521 + auVar254 * auVar520 + (auVar6 >> 0x34);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar11 = auVar256 * ZEXT816(0x1000003d1) + auVar253 * auVar519;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar660;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar623;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar624;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar642;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar648;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uVar648;
  auVar7 = auVar259 * auVar524 + auVar258 * auVar523 + (auVar7 >> 0x34);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar9 = (auVar11 >> 0x34) + auVar260 * ZEXT816(0x1000003d10) + auVar257 * auVar522;
  uVar625 = auVar9._0_8_;
  uVar653 = auVar9._8_8_;
  auVar584._8_8_ = uVar653 >> 0x34;
  auVar584._0_8_ = uVar653 * 0x1000 | uVar625 >> 0x34;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar642;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = uVar623;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar660;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = uVar660;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar624;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = uVar648;
  auVar7 = auVar263 * auVar527 + (auVar7 >> 0x34);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = auVar7._0_8_;
  auVar584 = auVar264 * ZEXT816(0x1000003d10) + auVar262 * auVar526 + auVar261 * auVar525 + auVar584
  ;
  auVar9 = auVar584 >> 0x34;
  auVar610._8_8_ = auVar9._8_8_;
  auVar610._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = auVar9._0_8_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = auVar7._8_8_;
  auVar611 = auVar265 * ZEXT816(0x1000003d10000) + auVar610 + auVar611;
  uVar653 = auVar611._0_8_;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar657;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = uVar651;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar659;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = uVar628;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar650;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = uVar636;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar644;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = uVar633;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar627;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = uVar639;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = SUB168(auVar270 * auVar532,0);
  auVar7 = auVar271 * ZEXT816(0x1000003d10) +
           auVar266 * auVar528 + auVar267 * auVar529 + auVar269 * auVar531 + auVar268 * auVar530;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar627;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = uVar651;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar657;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = uVar628;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar659;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = uVar636;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar650;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = uVar633;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar644;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = uVar639;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = SUB168(auVar270 * auVar532,8);
  auVar8 = auVar277 * ZEXT816(0x1000003d10000) +
           auVar272 * auVar533 +
           auVar273 * auVar534 + auVar274 * auVar535 + auVar276 * auVar537 + auVar275 * auVar536 +
           (auVar7 >> 0x34);
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar644;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = uVar651;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar627;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = uVar628;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar657;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = uVar636;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar659;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uVar633;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar650;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = uVar639;
  auVar9 = auVar282 * auVar542 + auVar281 * auVar541 + auVar280 * auVar540 + auVar279 * auVar539 +
           (auVar8 >> 0x34);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = (auVar9._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar8._6_2_ & 0xf);
  auVar10 = auVar278 * auVar538 + auVar283 * ZEXT816(0x1000003d1);
  uVar623 = auVar10._0_8_;
  uVar631 = auVar10._8_8_;
  uVar624 = uVar623 & 0xfffffffffffff;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar650;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar651;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar644;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = uVar628;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar627;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uVar636;
  auVar585._8_8_ = uVar631 >> 0x34;
  auVar585._0_8_ = uVar631 * 0x1000 | uVar623 >> 0x34;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar657;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = uVar633;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar659;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = uVar639;
  auVar9 = auVar286 * auVar545 + auVar288 * auVar547 + auVar287 * auVar546 + (auVar9 >> 0x34);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar585 = auVar289 * ZEXT816(0x1000003d10) + auVar284 * auVar543 + auVar285 * auVar544 + auVar585
  ;
  uVar631 = auVar585._0_8_ & 0xfffffffffffff;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar659;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar651;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar650;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar628;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar644;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar636;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar627;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar633;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar657;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = uVar639;
  auVar9 = auVar294 * auVar552 + auVar293 * auVar551 + (auVar9 >> 0x34);
  auVar295._8_8_ = 0;
  auVar295._0_8_ = auVar9._0_8_;
  auVar10 = auVar295 * ZEXT816(0x1000003d10) +
            auVar290 * auVar548 + auVar292 * auVar550 + auVar291 * auVar549 + (auVar585 >> 0x34);
  auVar12 = auVar10 >> 0x34;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = auVar12._0_8_;
  uVar628 = auVar10._0_8_ & 0xfffffffffffff;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = auVar9._8_8_;
  auVar612._8_8_ = auVar12._8_8_;
  auVar612._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar613 = auVar296 * ZEXT816(0x1000003d10000) + auVar612 + auVar613;
  uVar623 = auVar613._0_8_;
  uVar636 = (auVar613._8_8_ << 0xc | uVar623 >> 0x34) + (auVar8._0_8_ & 0xffffffffffff);
  uVar623 = uVar623 & 0xfffffffffffff;
  uVar633 = (auVar11._0_8_ & 0xfffffffffffff) + uVar620;
  uVar625 = (uVar625 & 0xfffffffffffff) + uVar652;
  uVar644 = (auVar584._0_8_ & 0xfffffffffffff) + uVar630;
  uVar639 = (uVar653 & 0xfffffffffffff) + uVar655;
  uVar657 = (auVar611._8_8_ << 0xc | uVar653 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff) + lVar661;
  uVar620 = uVar620 + uVar633 * 2;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar620;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = uVar648;
  uVar652 = uVar652 + uVar625 * 2;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar652;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar642;
  uVar630 = uVar630 + uVar644 * 2;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar630;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar660;
  uVar655 = uVar655 + uVar639 * 2;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar655;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar638;
  uVar651 = lVar661 + uVar657 * 2;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar651;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar632;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = SUB168(auVar301 * auVar557,0);
  auVar9 = auVar298 * auVar554 + auVar297 * auVar553 + auVar299 * auVar555 + auVar300 * auVar556 +
           auVar302 * ZEXT816(0x1000003d10);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar620;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = uVar632;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar652;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = uVar648;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar630;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar642;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar655;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar660;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar651;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = uVar638;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = SUB168(auVar301 * auVar557,8);
  auVar6 = auVar308 * ZEXT816(0x1000003d10000) +
           auVar307 * auVar562 +
           auVar306 * auVar561 + auVar305 * auVar560 + auVar303 * auVar558 + auVar304 * auVar559 +
           (auVar9 >> 0x34);
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar620;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = uVar638;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar652;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = uVar632;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar630;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = uVar648;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar655;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar642;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar651;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar660;
  auVar7 = auVar313 * auVar567 + auVar312 * auVar566 + auVar311 * auVar565 + auVar310 * auVar564 +
           (auVar6 >> 0x34);
  auVar314._8_8_ = 0;
  auVar314._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar309 * auVar563 + auVar314 * ZEXT816(0x1000003d1);
  uVar627 = auVar8._0_8_;
  uVar653 = auVar8._8_8_;
  auVar586._8_8_ = uVar653 >> 0x34;
  auVar586._0_8_ = uVar653 * 0x1000 | uVar627 >> 0x34;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar620;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar660;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar652;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = uVar638;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar630;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar632;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar655;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = uVar648;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar651;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uVar642;
  auVar7 = auVar319 * auVar572 + auVar318 * auVar571 + auVar317 * auVar570 + (auVar7 >> 0x34);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar586 = auVar320 * ZEXT816(0x1000003d10) + auVar315 * auVar568 + auVar316 * auVar569 + auVar586
  ;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar620;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = uVar642;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar652;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uVar660;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar630;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = uVar638;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar655;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = uVar632;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar651;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = uVar648;
  auVar7 = auVar325 * auVar577 + auVar324 * auVar576 + (auVar7 >> 0x34);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = auVar7._0_8_;
  auVar8 = auVar326 * ZEXT816(0x1000003d10) +
           auVar323 * auVar575 + auVar321 * auVar573 + auVar322 * auVar574 + (auVar586 >> 0x34);
  auVar10 = auVar8 >> 0x34;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = auVar10._0_8_;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = auVar7._8_8_;
  auVar614._8_8_ = auVar10._8_8_;
  auVar614._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar615 = auVar327 * ZEXT816(0x1000003d10000) + auVar614 + auVar615;
  uVar655 = auVar615._0_8_;
  lVar645 = 0xdffff1ffffca92 -
            ((uVar627 & 0xfffffffffffff) + (uVar621 & uVar635 | uVar640 & uVar629));
  uVar630 = -(ulong)((uint)lVar645 & 1);
  uVar652 = uVar630 >> 0xc;
  lVar646 = uVar652 - ((auVar586._0_8_ & 0xfffffffffffff) + (uVar622 & uVar635 | uVar658 & uVar629))
  ;
  lVar637 = uVar652 - ((auVar8._0_8_ & 0xfffffffffffff) + (uVar641 & uVar635 | uVar643 & uVar629));
  lVar634 = uVar652 - ((uVar655 & 0xfffffffffffff) + (uVar649 & uVar635 | uVar629 & uVar654));
  lVar661 = (uVar630 >> 0x10) -
            ((auVar6._0_8_ & 0xffffffffffff) +
             (uVar635 & uVar656 |
             (auVar609._8_8_ << 0xc | uVar654 >> 0x34) + (auVar605._0_8_ & 0xffffffffffff) & uVar626
             ) + (auVar615._8_8_ << 0xc | uVar655 >> 0x34));
  uVar620 = ((ulong)((uint)lVar646 & 1) << 0x33) + ((uVar652 & 0xffffefffffc2f) + lVar645 >> 1);
  uVar655 = ((ulong)((uint)lVar637 & 1) << 0x33) + (lVar646 + 0xdffffffffffff2U >> 1);
  uVar652 = ((ulong)((uint)lVar634 & 1) << 0x33) + (lVar637 + 0xdffffffffffff2U >> 1);
  uVar630 = ((ulong)((uint)lVar661 & 1) << 0x33) + (lVar634 + 0xdffffffffffff2U >> 1);
  (r->z).n[0] = uVar624;
  (r->z).n[1] = uVar631;
  (r->z).n[2] = uVar628;
  (r->z).n[3] = uVar623;
  (r->z).n[4] = uVar636;
  (r->x).n[0] = uVar633;
  (r->x).n[1] = uVar625;
  (r->x).n[2] = uVar644;
  (r->x).n[3] = uVar639;
  (r->x).n[4] = uVar657;
  (r->y).n[0] = uVar620;
  (r->y).n[1] = uVar655;
  (r->y).n[2] = uVar652;
  (r->y).n[3] = uVar630;
  uVar621 = lVar661 + 0xdfffffffffff2U >> 1;
  (r->y).n[4] = uVar621;
  uVar618 = a->infinity;
  uVar626 = (long)(int)uVar618 - 1;
  uVar651 = -(long)(int)uVar618;
  (r->x).n[0] = (b->x).n[0] & uVar651 | uVar633 & uVar626;
  (r->x).n[1] = (b->x).n[1] & uVar651 | uVar625 & uVar626;
  (r->x).n[2] = (b->x).n[2] & uVar651 | uVar644 & uVar626;
  (r->x).n[3] = (b->x).n[3] & uVar651 | uVar639 & uVar626;
  (r->x).n[4] = uVar651 & (b->x).n[4] | uVar657 & uVar626;
  uVar626 = (long)(int)uVar618 - 1;
  uVar651 = -(long)(int)uVar618;
  (r->y).n[0] = (b->y).n[0] & uVar651 | uVar620 & uVar626;
  (r->y).n[1] = (b->y).n[1] & uVar651 | uVar655 & uVar626;
  (r->y).n[2] = (b->y).n[2] & uVar651 | uVar652 & uVar626;
  (r->y).n[3] = (b->y).n[3] & uVar651 | uVar630 & uVar626;
  (r->y).n[4] = uVar651 & (b->y).n[4] | uVar621 & uVar626;
  uVar626 = (long)(int)uVar618 - 1;
  (r->z).n[0] = (ulong)(uVar618 & 1) | uVar624 & uVar626;
  (r->z).n[1] = uVar631 & uVar626;
  (r->z).n[2] = uVar628 & uVar626;
  (r->z).n[3] = uVar623 & uVar626;
  (r->z).n[4] = uVar636 & uVar626;
  iVar619 = secp256k1_fe_impl_normalizes_to_zero(&r->z);
  r->infinity = iVar619;
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 21 add/cmov/half/mul_int/negate/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int degenerate;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    VERIFY_CHECK(!b->infinity);

    /*  In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x;                                          /* u1 = U1 = X1*Z2^2 (GEJ_X_M) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y;                                          /* s1 = S1 = Y1*Z2^3 (GEJ_Y_M) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (GEJ_X_M+1) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 (2) */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (1) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (2) */
    /* If lambda = R/M = R/0 we have a problem (except in the "trivial"
     * case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr_alt = Y1*Z2^3 - Y2*Z1^3 (GEJ_Y_M*2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 (GEJ_X_M+2) */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);       /* rr_alt (GEJ_Y_M*2) */
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);         /* m_alt (GEJ_X_M+2) */
    /* Now Ralt / Malt = lambda and is guaranteed not to be Ralt / 0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t,
        SECP256K1_GEJ_X_MAGNITUDE_MAX + 1);             /* q = -T (GEJ_X_M+2) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);                           /* n = Malt^4 (1) */
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (GEJ_Y_M+2) */
    secp256k1_fe_negate(&r->y, &t,
        SECP256K1_GEJ_Y_MAGNITUDE_MAX + 2);             /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (GEJ_Y_M+3) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 ((GEJ_Y_M+3)/2 + 1) */

    /* In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);

    /* Set r->infinity if r->z is 0.
     *
     * If a->infinity is set, then r->infinity = (r->z == 0) = (1 == 0) = false,
     * which is correct because the function assumes that b is not infinity.
     *
     * Now assume !a->infinity. This implies Z = Z1 != 0.
     *
     * Case y1 = -y2:
     * In this case we could have a = -b, namely if x1 = x2.
     * We have degenerate = true, r->z = (x1 - x2) * Z.
     * Then r->infinity = ((x1 - x2)Z == 0) = (x1 == x2) = (a == -b).
     *
     * Case y1 != -y2:
     * In this case, we can't have a = -b.
     * We have degenerate = false, r->z = (y1 + y2) * Z.
     * Then r->infinity = ((y1 + y2)Z == 0) = (y1 == -y2) = false. */
    r->infinity = secp256k1_fe_normalizes_to_zero(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}